

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall Assembler::processInstrWithTwoReg(Assembler *this,string *instruction,int reg)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)instruction);
  instr2Bytes(this,&sStack_38,reg);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void Assembler::processInstrWithTwoReg(string instruction, int reg) {
    instr2Bytes(instruction, reg);
}